

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taia_sub.c
# Opt level: O0

void taia_sub(taia *t,taia *u,taia *v)

{
  ulong uVar1;
  ulong uVar2;
  unsigned_long uatto;
  unsigned_long unano;
  taia *v_local;
  taia *u_local;
  taia *t_local;
  
  uVar1 = u->nano;
  uVar2 = u->atto;
  (t->sec).x = (u->sec).x - (v->sec).x;
  t->nano = uVar1 - v->nano;
  t->atto = uVar2 - v->atto;
  if (uVar2 < t->atto) {
    t->atto = t->atto + 1000000000;
    t->nano = t->nano - 1;
  }
  if (uVar1 < t->nano) {
    t->nano = t->nano + 1000000000;
    (t->sec).x = (t->sec).x - 1;
  }
  return;
}

Assistant:

void taia_sub(struct taia *t,const struct taia *u,const struct taia *v)
{
  unsigned long unano = u->nano;
  unsigned long uatto = u->atto;
  
  t->sec.x = u->sec.x - v->sec.x;
  t->nano = unano - v->nano;
  t->atto = uatto - v->atto;
  if (t->atto > uatto) {
    t->atto += 1000000000UL;
    --t->nano;
  }
  if (t->nano > unano) {
    t->nano += 1000000000UL;
    --t->sec.x;
  }
}